

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_impl.hpp
# Opt level: O0

void __thiscall
websocketpp::connection<websocketpp::config::asio>::log_fail_result
          (connection<websocketpp::config::asio> *this)

{
  bool bVar1;
  value vVar2;
  string *psVar3;
  ulong uVar4;
  ostream *poVar5;
  element_type *this_00;
  error_code *this_01;
  basic_ostream<char,_std::char_traits<char>_> *pbVar6;
  element_type *this_02;
  string *in_RCX;
  long in_RDI;
  string ua;
  int version;
  stringstream s;
  error_code *in_stack_fffffffffffffc78;
  string *in_stack_fffffffffffffc80;
  parser *in_stack_fffffffffffffc88;
  string *in_stack_fffffffffffffc90;
  allocator *paVar7;
  string *in_stack_fffffffffffffc98;
  connection<websocketpp::config::asio::transport_config> *in_stack_fffffffffffffcc8;
  string local_308 [32];
  string local_2e8 [38];
  byte local_2c2;
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [32];
  string local_250 [32];
  string local_230 [39];
  allocator local_209;
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [52];
  int local_194;
  stringstream local_190 [16];
  ostream local_180 [8];
  request *in_stack_fffffffffffffe88;
  
  std::__cxx11::stringstream::stringstream(local_190);
  local_194 = processor::get_websocket_version<websocketpp::http::parser::request>
                        (in_stack_fffffffffffffe88);
  std::operator<<(local_180,"WebSocket Connection ");
  transport::asio::connection<websocketpp::config::asio::transport_config>::
  get_remote_endpoint_abi_cxx11_(in_stack_fffffffffffffcc8);
  std::operator<<(local_180,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  if (local_194 < 0) {
    std::operator<<(local_180," -");
  }
  else {
    poVar5 = std::operator<<(local_180," v");
    std::ostream::operator<<(poVar5,local_194);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"User-Agent",&local_209);
  psVar3 = http::parser::parser::get_header(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  std::__cxx11::string::string(local_1e8,(string *)psVar3);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    poVar5 = std::operator<<(local_180," \"");
    std::__cxx11::string::string(local_250,local_1e8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_270,"\"",&local_271);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_298,"\\\"",&local_299);
    in_RCX = local_298;
    utility::string_replace_all
              (in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
               &in_stack_fffffffffffffc88->m_version);
    poVar5 = std::operator<<(poVar5,local_230);
    std::operator<<(poVar5,"\" ");
    std::__cxx11::string::~string(local_230);
    std::__cxx11::string::~string(local_298);
    std::allocator<char>::~allocator((allocator<char> *)&local_299);
    std::__cxx11::string::~string(local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    std::__cxx11::string::~string(local_250);
  }
  else {
    std::operator<<(local_180," \"\" ");
  }
  poVar5 = local_180;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x4e58));
  local_2c2 = 0;
  if (bVar1) {
    this_00 = std::__shared_ptr_access<websocketpp::uri,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<websocketpp::uri,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x33736c);
    psVar3 = uri::get_resource_abi_cxx11_(this_00);
    std::__cxx11::string::string(local_2c0,(string *)psVar3);
  }
  else {
    paVar7 = &local_2c1;
    std::allocator<char>::allocator();
    local_2c2 = 1;
    std::__cxx11::string::string(local_2c0,"-",paVar7);
  }
  std::operator<<(poVar5,local_2c0);
  std::__cxx11::string::~string(local_2c0);
  if ((local_2c2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  }
  this_01 = (error_code *)std::operator<<(local_180," ");
  vVar2 = http::parser::response::get_status_code((response *)(in_RDI + 0x4d88));
  std::ostream::operator<<(this_01,vVar2);
  poVar5 = std::operator<<(local_180," ");
  pbVar6 = std::operator<<(poVar5,in_stack_fffffffffffffc78);
  poVar5 = std::operator<<(pbVar6," ");
  std::error_code::message_abi_cxx11_(this_01);
  std::operator<<(poVar5,local_2e8);
  std::__cxx11::string::~string(local_2e8);
  this_02 = std::
            __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x3374dc);
  std::__cxx11::stringstream::str();
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            (this_02,0x2000,local_308,(size_t)in_RCX);
  std::__cxx11::string::~string(local_308);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::stringstream::~stringstream(local_190);
  return;
}

Assistant:

void connection<config>::log_fail_result()
{
    std::stringstream s;
    
    int version = processor::get_websocket_version(m_request);

    // Connection Type
    s << "WebSocket Connection ";

    // Remote endpoint address & WebSocket version
    s << transport_con_type::get_remote_endpoint();
    if (version < 0) {
        s << " -";
    } else {
        s << " v" << version;
    }

    // User Agent
    std::string ua = m_request.get_header("User-Agent");
    if (ua.empty()) {
        s << " \"\" ";
    } else {
        // check if there are any quotes in the user agent
        s << " \"" << utility::string_replace_all(ua,"\"","\\\"") << "\" ";
    }

    // URI
    s << (m_uri ? m_uri->get_resource() : "-");

    // HTTP Status code
    s  << " " << m_response.get_status_code();
    
    // WebSocket++ error code & reason
    s << " " << m_ec << " " << m_ec.message();

    m_alog->write(log::alevel::fail,s.str());
}